

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O3

void __thiscall
asio::detail::
wait_handler<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_asio::any_io_executor>
::wait_handler(wait_handler<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_asio::any_io_executor>
               *this,_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
                     *h,any_io_executor *io_ex)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  error_category *peVar3;
  
  (this->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
  (this->super_wait_op).super_operation.func_ = do_complete;
  (this->super_wait_op).super_operation.task_result_ = 0;
  (this->super_wait_op).ec_._M_value = 0;
  peVar3 = (error_category *)std::_V2::system_category();
  (this->super_wait_op).ec_._M_cat = peVar3;
  (this->super_wait_op).cancellation_key_ = (void *)0x0;
  peVar2 = (h->_M_bound_args).
           super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
           super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
           super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->handler_)._M_f = h->_M_f;
  (this->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
  super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
  super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (h->_M_bound_args).
           super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
           super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
           super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (h->_M_bound_args).
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
  super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
  super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  (h->_M_bound_args).
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
  super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
  handler_work_base(&(this->work_).
                     super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                    ,0,0,io_ex);
  return;
}

Assistant:

wait_handler(Handler& h, const IoExecutor& io_ex)
    : wait_op(&wait_handler::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(h)),
      work_(handler_, io_ex)
  {
  }